

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EnforceEditionsSupport
          (CommandLineInterface *this,string *codegen_name,uint64_t supported_features,
          Edition minimum_edition,Edition maximum_edition,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  bool bVar1;
  reference ppFVar2;
  Arg *pAVar3;
  string_view filename;
  string_view format;
  string_view format_00;
  string_view format_01;
  Arg *in_stack_fffffffffffffc20;
  undefined1 local_3a8 [32];
  Arg local_388;
  string local_358;
  Arg local_338;
  Arg local_308;
  string_view local_2d8;
  Arg local_2c8;
  basic_string_view<char,_std::char_traits<char>_> local_298;
  string local_288;
  string local_268;
  Arg local_248;
  string local_218;
  Arg local_1f0;
  Arg local_1c0;
  string_view local_190;
  Arg local_180;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  string local_140;
  Arg local_110;
  string_view local_e0;
  Arg local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  string local_90;
  string_view local_70;
  Edition local_5c;
  FileDescriptor *pFStack_58;
  Edition edition;
  FileDescriptor *fd;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *__range2;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *parsed_files_local;
  Edition maximum_edition_local;
  Edition minimum_edition_local;
  uint64_t supported_features_local;
  string *codegen_name_local;
  CommandLineInterface *this_local;
  
  if ((this->experimental_editions_ & 1U) == 0) {
    pAVar3 = (Arg *)parsed_files;
    parsed_files_local._0_4_ = maximum_edition;
    parsed_files_local._4_4_ = minimum_edition;
    _maximum_edition_local = supported_features;
    supported_features_local = (uint64_t)codegen_name;
    codegen_name_local = &this->executable_name_;
    __end2 = std::
             vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::begin(parsed_files);
    fd = (FileDescriptor *)
         std::
         vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         ::end(parsed_files);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                                       *)&fd), bVar1) {
      ppFVar2 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                ::operator*(&__end2);
      pFStack_58 = *ppFVar2;
      local_5c = protobuf::internal::InternalFeatureHelper::GetEdition(pFStack_58);
      if (999 < (int)local_5c) {
        local_70 = FileDescriptor::name(pFStack_58);
        filename._M_str = local_70._M_str;
        filename._M_len = (size_t)filename._M_str;
        bVar1 = CanSkipEditionCheck((compiler *)local_70._M_len,filename);
        if (!bVar1) {
          if ((_maximum_edition_local & 2) == 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_a0,
                       "$0: is an editions file, but code generator $1 hasn\'t been updated to support editions yet.  Please ask the owner of this code generator to add support or switch back to proto2/proto3.\n\nSee https://protobuf.dev/editions/overview/ for more information."
                      );
            local_e0 = FileDescriptor::name(pFStack_58);
            absl::lts_20250127::substitute_internal::Arg::Arg(&local_d0,local_e0);
            absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                      (&local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       supported_features_local);
            format._M_str = (char *)&local_d0;
            format._M_len = (size_t)local_a0._M_str;
            absl::lts_20250127::Substitute_abi_cxx11_
                      (&local_90,(lts_20250127 *)local_a0._M_len,format,&local_110,pAVar3);
            std::operator<<((ostream *)&std::cerr,(string *)&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            return false;
          }
          if ((int)local_5c < (int)parsed_files_local._4_4_) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_150,
                       "$0: is a file using edition $2, which isn\'t supported by code generator $1.  Please upgrade your file to at least edition $3."
                      );
            local_190 = FileDescriptor::name(pFStack_58);
            absl::lts_20250127::substitute_internal::Arg::Arg(&local_180,local_190);
            absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                      (&local_1c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       supported_features_local);
            local_218.field_2._M_allocated_capacity = 0;
            local_218.field_2._8_8_ = 0;
            local_218._M_dataplus = (_Alloc_hider)0x0;
            local_218._1_7_ = 0;
            local_218._M_string_length = 0;
            absl::lts_20250127::strings_internal::StringifySink::StringifySink
                      ((StringifySink *)&local_218);
            absl::lts_20250127::substitute_internal::Arg::Arg<google::protobuf::Edition,void>
                      (&local_1f0,&local_5c,(StringifySink *)&local_218);
            local_268.field_2._M_allocated_capacity = 0;
            local_268.field_2._8_8_ = 0;
            local_268._M_dataplus = (_Alloc_hider)0x0;
            local_268._1_7_ = 0;
            local_268._M_string_length = 0;
            absl::lts_20250127::strings_internal::StringifySink::StringifySink
                      ((StringifySink *)&local_268);
            absl::lts_20250127::substitute_internal::Arg::Arg<google::protobuf::Edition,void>
                      (&local_248,(Edition *)((long)&parsed_files_local + 4),
                       (StringifySink *)&local_268);
            format_00._M_str = (char *)&local_180;
            format_00._M_len = (size_t)local_150._M_str;
            absl::lts_20250127::Substitute_abi_cxx11_
                      (&local_140,(lts_20250127 *)local_150._M_len,format_00,&local_1c0,&local_1f0,
                       &local_248,in_stack_fffffffffffffc20);
            std::operator<<((ostream *)&std::cerr,(string *)&local_140);
            std::__cxx11::string::~string((string *)&local_140);
            absl::lts_20250127::strings_internal::StringifySink::~StringifySink
                      ((StringifySink *)&local_268);
            absl::lts_20250127::strings_internal::StringifySink::~StringifySink
                      ((StringifySink *)&local_218);
            return false;
          }
          if ((int)(Edition)parsed_files_local < (int)local_5c) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_298,
                       "$0: is a file using edition $2, which isn\'t supported by code generator $1.  Please ask the owner of this code generator to add support or switch back to a maximum of edition $3."
                      );
            local_2d8 = FileDescriptor::name(pFStack_58);
            absl::lts_20250127::substitute_internal::Arg::Arg(&local_2c8,local_2d8);
            absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                      (&local_308,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       supported_features_local);
            local_358.field_2._M_allocated_capacity = 0;
            local_358.field_2._8_8_ = 0;
            local_358._M_dataplus = (_Alloc_hider)0x0;
            local_358._1_7_ = 0;
            local_358._M_string_length = 0;
            absl::lts_20250127::strings_internal::StringifySink::StringifySink
                      ((StringifySink *)&local_358);
            absl::lts_20250127::substitute_internal::Arg::Arg<google::protobuf::Edition,void>
                      (&local_338,&local_5c,(StringifySink *)&local_358);
            local_3a8._16_8_ = 0;
            local_3a8[0x18] = '\0';
            local_3a8[0x19] = '\0';
            local_3a8[0x1a] = '\0';
            local_3a8[0x1b] = '\0';
            local_3a8[0x1c] = '\0';
            local_3a8[0x1d] = '\0';
            local_3a8[0x1e] = '\0';
            local_3a8[0x1f] = '\0';
            local_3a8._0_8_ = 0;
            local_3a8._8_8_ = (char *)0x0;
            pAVar3 = (Arg *)local_3a8;
            absl::lts_20250127::strings_internal::StringifySink::StringifySink
                      ((StringifySink *)pAVar3);
            absl::lts_20250127::substitute_internal::Arg::Arg<google::protobuf::Edition,void>
                      (&local_388,(Edition *)&parsed_files_local,(StringifySink *)pAVar3);
            format_01._M_str = (char *)&local_2c8;
            format_01._M_len = (size_t)local_298._M_str;
            absl::lts_20250127::Substitute_abi_cxx11_
                      (&local_288,(lts_20250127 *)local_298._M_len,format_01,&local_308,&local_338,
                       &local_388,pAVar3);
            std::operator<<((ostream *)&std::cerr,(string *)&local_288);
            std::__cxx11::string::~string((string *)&local_288);
            absl::lts_20250127::strings_internal::StringifySink::~StringifySink
                      ((StringifySink *)local_3a8);
            absl::lts_20250127::strings_internal::StringifySink::~StringifySink
                      ((StringifySink *)&local_358);
            return false;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
      ::operator++(&__end2);
    }
  }
  return true;
}

Assistant:

bool CommandLineInterface::EnforceEditionsSupport(
    const std::string& codegen_name, uint64_t supported_features,
    Edition minimum_edition, Edition maximum_edition,
    const std::vector<const FileDescriptor*>& parsed_files) const {
  if (experimental_editions_) {
    // The user has explicitly specified the experimental flag.
    return true;
  }
  for (const auto* fd : parsed_files) {
    Edition edition =
        ::google::protobuf::internal::InternalFeatureHelper::GetEdition(*fd);
    if (edition < Edition::EDITION_2023 || CanSkipEditionCheck(fd->name())) {
      // Legacy proto2/proto3 or exempted files don't need any checks.
      continue;
    }

    if ((supported_features & CodeGenerator::FEATURE_SUPPORTS_EDITIONS) == 0) {
      std::cerr << absl::Substitute(
          "$0: is an editions file, but code generator $1 hasn't been "
          "updated to support editions yet.  Please ask the owner of this code "
          "generator to add support or switch back to proto2/proto3.\n\nSee "
          "https://protobuf.dev/editions/overview/ for more information.",
          fd->name(), codegen_name);
      return false;
    }
    if (edition < minimum_edition) {
      std::cerr << absl::Substitute(
          "$0: is a file using edition $2, which isn't supported by code "
          "generator $1.  Please upgrade your file to at least edition $3.",
          fd->name(), codegen_name, edition, minimum_edition);
      return false;
    }
    if (edition > maximum_edition) {
      std::cerr << absl::Substitute(
          "$0: is a file using edition $2, which isn't supported by code "
          "generator $1.  Please ask the owner of this code generator to add "
          "support or switch back to a maximum of edition $3.",
          fd->name(), codegen_name, edition, maximum_edition);
      return false;
    }
  }
  return true;
}